

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_exttime(char *p,rar *rar,char *endp)

{
  ushort uVar1;
  uint16_t uVar2;
  ulong uVar3;
  char *in_RDX;
  long in_RSI;
  void *in_RDI;
  long nsec;
  time_t t;
  tm *tm;
  int i;
  int ttime;
  uint count;
  uint j;
  uint rem;
  uint flags;
  uint rmode;
  time_t local_50;
  tm *local_48;
  int local_3c;
  uint32_t local_38;
  uint local_34;
  uint local_30;
  uint in_stack_ffffffffffffffd4;
  char *local_10;
  int local_4;
  
  if (in_RDX < (char *)((long)in_RDI + 2)) {
    local_4 = -1;
  }
  else {
    uVar2 = archive_le16dec(in_RDI);
    local_10 = (char *)((long)in_RDI + 2);
    for (local_3c = 3; -1 < local_3c; local_3c = local_3c + -1) {
      local_50 = 0;
      if (local_3c == 3) {
        local_50 = *(long *)(in_RSI + 0x30);
      }
      uVar1 = uVar2 >> ((byte)(local_3c << 2) & 0x1f);
      if ((uVar1 & 8) != 0) {
        if (local_50 == 0) {
          if (in_RDX < local_10 + 4) {
            return -1;
          }
          local_38 = archive_le32dec(local_10);
          local_50 = get_time(in_stack_ffffffffffffffd4);
          local_10 = local_10 + 4;
        }
        in_stack_ffffffffffffffd4 = 0;
        local_34 = uVar1 & 3;
        if (in_RDX < local_10 + local_34) {
          return -1;
        }
        for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
          in_stack_ffffffffffffffd4 = (int)*local_10 << 0x10 | in_stack_ffffffffffffffd4 >> 8;
          local_10 = local_10 + 1;
        }
        local_48 = localtime(&local_50);
        uVar3 = (ulong)(local_48->tm_sec + in_stack_ffffffffffffffd4 / 10000000);
        if ((uVar1 & 4) != 0) {
          local_48->tm_sec = local_48->tm_sec + 1;
          local_50 = mktime(local_48);
        }
        if (local_3c == 3) {
          *(time_t *)(in_RSI + 0x30) = local_50;
          *(ulong *)(in_RSI + 0x38) = uVar3;
        }
        else if (local_3c == 2) {
          *(time_t *)(in_RSI + 0x78) = local_50;
          *(ulong *)(in_RSI + 0x80) = uVar3;
        }
        else if (local_3c == 1) {
          *(time_t *)(in_RSI + 0x68) = local_50;
          *(ulong *)(in_RSI + 0x70) = uVar3;
        }
        else {
          *(time_t *)(in_RSI + 0x88) = local_50;
          *(ulong *)(in_RSI + 0x90) = uVar3;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
read_exttime(const char *p, struct rar *rar, const char *endp)
{
  unsigned rmode, flags, rem, j, count;
  int ttime, i;
  struct tm *tm;
  time_t t;
  long nsec;

  if (p + 2 > endp)
    return (-1);
  flags = archive_le16dec(p);
  p += 2;

  for (i = 3; i >= 0; i--)
  {
    t = 0;
    if (i == 3)
      t = rar->mtime;
    rmode = flags >> i * 4;
    if (rmode & 8)
    {
      if (!t)
      {
        if (p + 4 > endp)
          return (-1);
        ttime = archive_le32dec(p);
        t = get_time(ttime);
        p += 4;
      }
      rem = 0;
      count = rmode & 3;
      if (p + count > endp)
        return (-1);
      for (j = 0; j < count; j++)
      {
        rem = ((*p) << 16) | (rem >> 8);
        p++;
      }
      tm = localtime(&t);
      nsec = tm->tm_sec + rem / NS_UNIT;
      if (rmode & 4)
      {
        tm->tm_sec++;
        t = mktime(tm);
      }
      if (i == 3)
      {
        rar->mtime = t;
        rar->mnsec = nsec;
      }
      else if (i == 2)
      {
        rar->ctime = t;
        rar->cnsec = nsec;
      }
      else if (i == 1)
      {
        rar->atime = t;
        rar->ansec = nsec;
      }
      else
      {
        rar->arctime = t;
        rar->arcnsec = nsec;
      }
    }
  }
  return (0);
}